

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

void Am_Fly_Apart_Animator_Abort_Do_proc(Am_Object *interp)

{
  Am_Value *in_value;
  undefined1 in_CL;
  Am_Value value;
  Am_Object local_28;
  Am_Value local_20;
  
  Am_Object::Am_Object(&local_28,interp);
  Am_Set_Animated_Slots(&local_28);
  Am_Object::~Am_Object(&local_28);
  delete_all_parts(interp);
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  in_value = Am_Object::Get(interp,0xc5,1);
  Am_Value::operator=(&value,in_value);
  Am_Value::Am_Value(&local_20,&value);
  call_all_commands(&local_20,0xc9,interp,(bool)in_CL);
  Am_Value::~Am_Value(&local_20);
  Am_Value::~Am_Value(&value);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Fly_Apart_Animator_Abort_Do,
                 (Am_Object interp))
{
  Am_INTER_TRACE_PRINT(interp, "Fly Apart Abort of " << interp);
  Am_Set_Animated_Slots(interp);
  delete_all_parts(interp);

  Am_Value value;
  value = interp.Peek(Am_COMMAND);
  call_all_commands(value, Am_ABORT_DO_METHOD, interp, false);
}